

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinImporter::ReadBinaryScene(AssbinImporter *this,IOStream *stream,aiScene *scene)

{
  uint uVar1;
  aiMesh **__s;
  aiMesh *paVar2;
  aiMaterial **__s_00;
  AssbinImporter *this_00;
  aiAnimation **__s_01;
  aiAnimation *paVar3;
  aiTexture **__s_02;
  aiTexture *paVar4;
  aiLight **__s_03;
  aiLight *paVar5;
  aiCamera **__s_04;
  aiCamera *paVar6;
  runtime_error *this_01;
  AssbinImporter *pAVar7;
  uint i_3;
  ulong uVar8;
  uint i_1;
  uint i;
  ulong uVar9;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 == 0x1239) {
    Read<unsigned_int>(stream);
    uVar1 = Read<unsigned_int>(stream);
    scene->mFlags = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumMeshes = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumMaterials = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumAnimations = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumTextures = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumLights = uVar1;
    uVar1 = Read<unsigned_int>(stream);
    scene->mNumCameras = uVar1;
    ReadBinaryNode(this,stream,&scene->mRootNode,(aiNode *)0x0);
    if ((ulong)scene->mNumMeshes != 0) {
      uVar8 = (ulong)scene->mNumMeshes << 3;
      __s = (aiMesh **)operator_new__(uVar8);
      scene->mMeshes = __s;
      memset(__s,0,uVar8);
      uVar8 = 0;
      do {
        paVar2 = (aiMesh *)operator_new(0x520);
        paVar2->mPrimitiveTypes = 0;
        paVar2->mNumVertices = 0;
        paVar2->mNumFaces = 0;
        memset(&paVar2->mVertices,0,0xcc);
        paVar2->mBones = (aiBone **)0x0;
        paVar2->mMaterialIndex = 0;
        (paVar2->mName).length = 0;
        (paVar2->mName).data[0] = '\0';
        memset((paVar2->mName).data + 1,0x1b,0x3ff);
        paVar2->mNumAnimMeshes = 0;
        paVar2->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar2->mMethod = 0;
        (paVar2->mAABB).mMin.x = 0.0;
        (paVar2->mAABB).mMin.y = 0.0;
        (paVar2->mAABB).mMin.z = 0.0;
        (paVar2->mAABB).mMax.x = 0.0;
        (paVar2->mAABB).mMax.y = 0.0;
        (paVar2->mAABB).mMax.z = 0.0;
        memset(paVar2->mColors,0,0xa0);
        scene->mMeshes[uVar8] = paVar2;
        ReadBinaryMesh(this,stream,scene->mMeshes[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar8 < scene->mNumMeshes);
    }
    if ((ulong)scene->mNumMaterials != 0) {
      uVar8 = (ulong)scene->mNumMaterials << 3;
      __s_00 = (aiMaterial **)operator_new__(uVar8);
      scene->mMaterials = __s_00;
      uVar9 = 0;
      memset(__s_00,0,uVar8);
      do {
        this_00 = (AssbinImporter *)operator_new(0x10);
        pAVar7 = this_00;
        aiMaterial::aiMaterial((aiMaterial *)this_00);
        scene->mMaterials[uVar9] = (aiMaterial *)this_00;
        ReadBinaryMaterial(pAVar7,stream,scene->mMaterials[uVar9]);
        uVar9 = uVar9 + 1;
      } while (uVar9 < scene->mNumMaterials);
    }
    if ((ulong)scene->mNumAnimations != 0) {
      uVar8 = (ulong)scene->mNumAnimations << 3;
      __s_01 = (aiAnimation **)operator_new__(uVar8);
      scene->mAnimations = __s_01;
      memset(__s_01,0,uVar8);
      uVar8 = 0;
      do {
        paVar3 = (aiAnimation *)operator_new(0x448);
        (paVar3->mName).length = 0;
        (paVar3->mName).data[0] = '\0';
        memset((paVar3->mName).data + 1,0x1b,0x3ff);
        paVar3->mDuration = -1.0;
        paVar3->mTicksPerSecond = 0.0;
        paVar3->mNumChannels = 0;
        paVar3->mChannels = (aiNodeAnim **)0x0;
        paVar3->mNumMeshChannels = 0;
        paVar3->mMeshChannels = (aiMeshAnim **)0x0;
        paVar3->mNumMorphMeshChannels = 0;
        paVar3->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
        scene->mAnimations[uVar8] = paVar3;
        ReadBinaryAnim(this,stream,scene->mAnimations[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar8 < scene->mNumAnimations);
    }
    if ((ulong)scene->mNumTextures != 0) {
      uVar8 = (ulong)scene->mNumTextures << 3;
      __s_02 = (aiTexture **)operator_new__(uVar8);
      scene->mTextures = __s_02;
      memset(__s_02,0,uVar8);
      uVar8 = 0;
      do {
        paVar4 = (aiTexture *)operator_new(0x428);
        paVar4->mWidth = 0;
        paVar4->mHeight = 0;
        paVar4->pcData = (aiTexel *)0x0;
        (paVar4->mFilename).length = 0;
        (paVar4->mFilename).data[0] = '\0';
        memset((paVar4->mFilename).data + 1,0x1b,0x3ff);
        paVar4->achFormatHint[0] = '\0';
        paVar4->achFormatHint[1] = '\0';
        paVar4->achFormatHint[2] = '\0';
        paVar4->achFormatHint[3] = '\0';
        scene->mTextures[uVar8] = paVar4;
        ReadBinaryTexture(this,stream,scene->mTextures[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar8 < scene->mNumTextures);
    }
    if ((ulong)scene->mNumLights != 0) {
      uVar9 = (ulong)scene->mNumLights << 3;
      __s_03 = (aiLight **)operator_new__(uVar9);
      scene->mLights = __s_03;
      uVar8 = 0;
      memset(__s_03,0,uVar9);
      do {
        paVar5 = (aiLight *)operator_new(0x46c);
        (paVar5->mName).length = 0;
        (paVar5->mName).data[0] = '\0';
        pAVar7 = (AssbinImporter *)((paVar5->mName).data + 1);
        memset(pAVar7,0x1b,0x3ff);
        paVar5->mType = aiLightSource_UNDEFINED;
        (paVar5->mPosition).x = 0.0;
        (paVar5->mPosition).y = 0.0;
        (paVar5->mPosition).z = 0.0;
        (paVar5->mDirection).x = 0.0;
        (paVar5->mDirection).y = 0.0;
        *(undefined8 *)&(paVar5->mDirection).z = 0;
        (paVar5->mUp).x = 0.0;
        (paVar5->mUp).y = 0.0;
        *(undefined8 *)&(paVar5->mUp).z = 0;
        paVar5->mAttenuationLinear = 1.0;
        paVar5->mAttenuationQuadratic = 0.0;
        (paVar5->mColorDiffuse).r = 0.0;
        (paVar5->mColorDiffuse).g = 0.0;
        (paVar5->mColorDiffuse).b = 0.0;
        (paVar5->mColorSpecular).r = 0.0;
        (paVar5->mColorSpecular).g = 0.0;
        *(undefined8 *)&(paVar5->mColorSpecular).b = 0;
        (paVar5->mColorAmbient).g = 0.0;
        (paVar5->mColorAmbient).b = 0.0;
        paVar5->mAngleInnerCone = 6.2831855;
        paVar5->mAngleOuterCone = 6.2831855;
        (paVar5->mSize).x = 0.0;
        (paVar5->mSize).y = 0.0;
        scene->mLights[uVar8] = paVar5;
        ReadBinaryLight(pAVar7,stream,scene->mLights[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar8 < scene->mNumLights);
    }
    if ((ulong)scene->mNumCameras != 0) {
      uVar8 = (ulong)scene->mNumCameras << 3;
      __s_04 = (aiCamera **)operator_new__(uVar8);
      scene->mCameras = __s_04;
      memset(__s_04,0,uVar8);
      uVar8 = 0;
      do {
        paVar6 = (aiCamera *)operator_new(0x438);
        (paVar6->mName).length = 0;
        (paVar6->mName).data[0] = '\0';
        pAVar7 = (AssbinImporter *)((paVar6->mName).data + 1);
        memset(pAVar7,0x1b,0x3ff);
        (paVar6->mPosition).x = 0.0;
        (paVar6->mPosition).y = 0.0;
        *(undefined8 *)&(paVar6->mPosition).z = 0;
        (paVar6->mUp).y = 1.0;
        (paVar6->mUp).z = 0.0;
        (paVar6->mLookAt).x = 0.0;
        (paVar6->mLookAt).y = 0.0;
        *(undefined8 *)&(paVar6->mLookAt).z = 0x3f490fdb3f800000;
        paVar6->mClipPlaneNear = 0.1;
        paVar6->mClipPlaneFar = 1000.0;
        paVar6->mAspect = 0.0;
        scene->mCameras[uVar8] = paVar6;
        ReadBinaryCamera(pAVar7,stream,scene->mCameras[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar8 < scene->mNumCameras);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Magic chunk identifiers are wrong!","");
  std::runtime_error::runtime_error(this_01,(string *)local_50);
  *(undefined ***)this_01 = &PTR__runtime_error_00875f28;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryScene( IOStream * stream, aiScene* scene ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AISCENE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    scene->mFlags         = Read<unsigned int>(stream);
    scene->mNumMeshes     = Read<unsigned int>(stream);
    scene->mNumMaterials  = Read<unsigned int>(stream);
    scene->mNumAnimations = Read<unsigned int>(stream);
    scene->mNumTextures   = Read<unsigned int>(stream);
    scene->mNumLights     = Read<unsigned int>(stream);
    scene->mNumCameras    = Read<unsigned int>(stream);

    // Read node graph
    //scene->mRootNode = new aiNode[1];
    ReadBinaryNode( stream, &scene->mRootNode, (aiNode*)NULL );

    // Read all meshes
    if (scene->mNumMeshes) {
        scene->mMeshes = new aiMesh*[scene->mNumMeshes];
        memset(scene->mMeshes, 0, scene->mNumMeshes*sizeof(aiMesh*));
        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            scene->mMeshes[i] = new aiMesh();
            ReadBinaryMesh( stream,scene->mMeshes[i]);
        }
    }

    // Read materials
    if (scene->mNumMaterials) {
        scene->mMaterials = new aiMaterial*[scene->mNumMaterials];
        memset(scene->mMaterials, 0, scene->mNumMaterials*sizeof(aiMaterial*));
        for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
            scene->mMaterials[i] = new aiMaterial();
            ReadBinaryMaterial(stream,scene->mMaterials[i]);
        }
    }

    // Read all animations
    if (scene->mNumAnimations) {
        scene->mAnimations = new aiAnimation*[scene->mNumAnimations];
        memset(scene->mAnimations, 0, scene->mNumAnimations*sizeof(aiAnimation*));
        for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
            scene->mAnimations[i] = new aiAnimation();
            ReadBinaryAnim(stream,scene->mAnimations[i]);
        }
    }

    // Read all textures
    if (scene->mNumTextures) {
        scene->mTextures = new aiTexture*[scene->mNumTextures];
        memset(scene->mTextures, 0, scene->mNumTextures*sizeof(aiTexture*));
        for (unsigned int i = 0; i < scene->mNumTextures;++i) {
            scene->mTextures[i] = new aiTexture();
            ReadBinaryTexture(stream,scene->mTextures[i]);
        }
    }

    // Read lights
    if (scene->mNumLights) {
        scene->mLights = new aiLight*[scene->mNumLights];
        memset(scene->mLights, 0, scene->mNumLights*sizeof(aiLight*));
        for (unsigned int i = 0; i < scene->mNumLights;++i) {
            scene->mLights[i] = new aiLight();
            ReadBinaryLight(stream,scene->mLights[i]);
        }
    }

    // Read cameras
    if (scene->mNumCameras) {
        scene->mCameras = new aiCamera*[scene->mNumCameras];
        memset(scene->mCameras, 0, scene->mNumCameras*sizeof(aiCamera*));
        for (unsigned int i = 0; i < scene->mNumCameras;++i) {
            scene->mCameras[i] = new aiCamera();
            ReadBinaryCamera(stream,scene->mCameras[i]);
        }
    }

}